

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::descriptor_set_layout_is_supported
          (Impl *this,VkDescriptorSetLayoutCreateInfo *info)

{
  pointer pcVar1;
  uint uVar2;
  VkDescriptorType VVar3;
  uint32_t uVar4;
  VkBool32 VVar5;
  DeviceQueryInterface *pDVar6;
  int iVar7;
  char cVar8;
  const_iterator cVar9;
  int *piVar10;
  int *piVar11;
  key_type *pkVar12;
  byte bVar13;
  VkDescriptorSetLayoutBinding *pVVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  undefined4 uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  DescriptorCounts counts;
  undefined1 local_a8 [12];
  undefined1 auStack_9c [4];
  undefined1 local_98 [8];
  undefined1 auStack_90 [8];
  key_type local_88;
  long local_68;
  ulong local_60;
  int *local_58;
  key_type local_50;
  
  if ((info->flags & 0xffffff0c) != 0) {
    return false;
  }
  if (this->null_device != false) {
    return true;
  }
  if ((info->flags & 1) != 0) {
    pcVar1 = local_a8 + 0x10;
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"VK_KHR_push_descriptor","");
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this,(key_type *)local_a8);
    if (cVar9.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      VVar5 = (this->features).vk14.pushDescriptor;
      if ((pointer)local_a8._0_8_ != pcVar1) {
        operator_delete((void *)local_a8._0_8_,(long)local_98 + 1);
      }
      if (VVar5 == 0) {
        return false;
      }
    }
    else if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,(long)local_98 + 1);
    }
  }
  if ((info->flags & 2) != 0) {
    pcVar1 = local_a8 + 0x10;
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"VK_EXT_descriptor_indexing","");
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this,(key_type *)local_a8);
    if (cVar9.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      VVar5 = (this->features).vk12.descriptorIndexing;
      if ((pointer)local_a8._0_8_ != pcVar1) {
        operator_delete((void *)local_a8._0_8_,(long)local_98 + 1);
      }
      if (VVar5 == 0) {
        return false;
      }
    }
    else if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_,(long)local_98 + 1);
    }
  }
  uVar2 = info->flags;
  if ((uVar2 & 0x30) != 0) {
    if ((this->features).descriptor_buffer.descriptorBuffer == 0) {
      return false;
    }
    if (((uVar2 & 1) != 0) &&
       ((this->features).descriptor_buffer.descriptorBufferPushDescriptors == 0)) {
      return false;
    }
  }
  if (((char)uVar2 < '\0') &&
     ((this->features).device_generated_commands_compute_nv.deviceGeneratedCompute == 0)) {
    return false;
  }
  if (((uVar2 & 0x40) != 0) &&
     ((this->features).per_stage_descriptor_set_nv.perStageDescriptorSet == 0)) {
    return false;
  }
  local_98 = (undefined1  [8])0x0;
  auStack_90 = (undefined1  [8])0x0;
  local_a8._0_8_ = (pointer)0x0;
  stack0xffffffffffffff60 = 0;
  local_88._M_dataplus._M_p._0_4_ = 0;
  piVar10 = (int *)info->pNext;
  for (piVar11 = piVar10; piVar11 != (int *)0x0; piVar11 = *(int **)(piVar11 + 2)) {
    if (*piVar11 == 0x3b9d3ee8) goto LAB_0019293e;
  }
  piVar11 = (int *)0x0;
LAB_0019293e:
  do {
    if (piVar10 == (int *)0x0) break;
    if (*piVar10 == 0x3ba0251a) goto LAB_00192963;
    piVar10 = *(int **)(piVar10 + 2);
  } while( true );
  piVar10 = (int *)0x0;
LAB_00192963:
  bVar23 = info->bindingCount == 0;
  bVar22 = !bVar23;
  if (bVar23) {
    uVar15 = 0;
    uVar18 = 0;
  }
  else {
    pVVar14 = info->pBindings;
    bVar23 = shader_stage_mask_is_supported(this,pVVar14->stageFlags);
    uVar15 = 0;
    if (bVar23) {
      local_58 = piVar10;
      local_60 = 0;
      local_88.field_2._12_4_ = 0;
      uVar21 = 0;
      do {
        if (piVar11 != (int *)0x0) {
          uVar15 = *(uint *)(*(long *)(piVar11 + 6) + uVar21 * 4);
          if (uVar15 < 0x10) {
            if ((uint)piVar11[4] <= uVar21) goto LAB_001929cb;
            bVar13 = (byte)uVar15 & 1;
            goto LAB_001929cd;
          }
          goto LAB_00192d49;
        }
LAB_001929cb:
        bVar13 = 0;
LAB_001929cd:
        lVar20 = uVar21 * 3;
        VVar3 = pVVar14[uVar21].descriptorType;
        bVar23 = false;
        if (0x3b9d13ef < (int)VVar3) {
          if (VVar3 + 0xc45e7f40 < 2) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            local_68 = lVar20;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"VK_QCOM_image_processing","");
            cVar9 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)this,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            pkVar12 = (key_type *)0x0;
            lVar20 = local_68;
            if (cVar9.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) goto LAB_00192dc1;
            goto LAB_00192d49;
          }
          if (VVar3 == VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR) {
            bVar23 = false;
            if (((bVar13 & (this->features).acceleration_structure.
                           descriptorBindingAccelerationStructureUpdateAfterBind == 0) == 0) &&
               (pkVar12 = &local_88,
               (this->features).acceleration_structure.accelerationStructure != 0))
            goto LAB_00192dc1;
          }
          else if (VVar3 == VK_DESCRIPTOR_TYPE_MUTABLE_EXT) {
            bVar24 = false;
            if ((local_58 != (int *)0x0) &&
               ((this->features).mutable_descriptor_type.mutableDescriptorType != 0)) {
              bVar24 = false;
              iVar17 = 0;
              if (uVar21 < (uint)local_58[4]) {
                local_68 = lVar20;
                uVar16 = (ulong)*(uint *)(*(long *)(local_58 + 6) + uVar21 * 0x10);
                bVar23 = uVar16 != 0;
                if (uVar16 == 0) {
                  local_88.field_2._M_allocated_capacity._0_4_ = 0;
                  local_88.field_2._M_allocated_capacity._4_4_ = 0;
                  local_88.field_2._8_4_ = 0;
                }
                else {
                  local_88.field_2._8_4_ = 0;
                  local_88.field_2._M_allocated_capacity._4_4_ = 0;
                  local_88.field_2._M_allocated_capacity._0_4_ = 0;
                  iVar17 = 0;
                  uVar19 = 1;
                  do {
                    uVar15 = *(uint *)(*(long *)(*(long *)(local_58 + 6) + uVar21 * 0x10 + 8) + -4 +
                                      uVar19 * 4);
                    if (7 < (ulong)uVar15) goto switchD_00192b2c_caseD_1;
                    iVar7 = 1;
                    switch(uVar15) {
                    case 0:
                      local_88.field_2._12_4_ =
                           (uint)CONCAT71((int7)((ulong)((long)&switchD_00192b2c::
                                                                switchdataD_0024e904 +
                                                        (long)(int)(&switchD_00192b2c::
                                                                     switchdataD_0024e904)[uVar15])
                                                >> 8),1);
                      break;
                    case 1:
                      goto switchD_00192b2c_caseD_1;
                    case 2:
                      VVar5 = (this->features).descriptor_indexing.
                              descriptorBindingSampledImageUpdateAfterBind;
                      goto joined_r0x00192b53;
                    case 3:
                      if (((this->features).descriptor_indexing.
                           descriptorBindingStorageImageUpdateAfterBind == 0 & bVar13) != 0)
                      goto switchD_00192b2c_caseD_1;
LAB_00192b95:
                      local_88.field_2._M_allocated_capacity._0_4_ = 1;
                      iVar7 = iVar17;
                      break;
                    case 4:
                      VVar5 = (this->features).descriptor_indexing.
                              descriptorBindingUniformTexelBufferUpdateAfterBind;
joined_r0x00192b53:
                      if ((VVar5 == 0 & bVar13) != 0) goto switchD_00192b2c_caseD_1;
                      break;
                    case 5:
                      if (((this->features).descriptor_indexing.
                           descriptorBindingStorageTexelBufferUpdateAfterBind == 0 & bVar13) == 0)
                      goto LAB_00192b95;
switchD_00192b2c_caseD_1:
                      if (bVar23) {
                        bVar24 = false;
                        goto LAB_00192db8;
                      }
                      goto LAB_00192d83;
                    case 6:
                      if (((this->features).descriptor_indexing.
                           descriptorBindingUniformBufferUpdateAfterBind == 0 & bVar13) != 0)
                      goto switchD_00192b2c_caseD_1;
                      local_88.field_2._8_4_ = 1;
                      iVar7 = iVar17;
                      break;
                    case 7:
                      if (((this->features).descriptor_indexing.
                           descriptorBindingStorageBufferUpdateAfterBind == 0 & bVar13) != 0)
                      goto switchD_00192b2c_caseD_1;
                      local_88.field_2._M_allocated_capacity._4_4_ = 1;
                      iVar7 = iVar17;
                    }
                    iVar17 = iVar7;
                    bVar23 = uVar19 < uVar16;
                    bVar24 = uVar19 != uVar16;
                    uVar19 = uVar19 + 1;
                  } while (bVar24);
                }
LAB_00192d83:
                uVar4 = pVVar14[uVar21].descriptorCount;
                local_a8._4_4_ =
                     local_a8._4_4_ + local_88.field_2._M_allocated_capacity._0_4_ * uVar4;
                local_a8._0_4_ = local_a8._0_4_ + iVar17 * uVar4;
                stack0xffffffffffffff60 =
                     CONCAT44((int)auStack_9c + local_88.field_2._8_4_ * uVar4,
                              local_a8._8_4_ + local_88.field_2._M_allocated_capacity._4_4_ * uVar4)
                ;
                bVar24 = true;
              }
            }
LAB_00192db8:
            bVar23 = false;
            if (bVar24) goto LAB_00192dbf;
          }
          goto LAB_00192de6;
        }
        switch(VVar3) {
        case VK_DESCRIPTOR_TYPE_SAMPLER:
          if ((bVar13 & (this->features).descriptor_indexing.
                        descriptorBindingSampledImageUpdateAfterBind == 0) != 0) goto LAB_00192d49;
          pkVar12 = (key_type *)(local_a8 + 0x14);
          break;
        case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
        case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
          VVar5 = (this->features).descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind;
          goto LAB_00192caa;
        case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
          VVar5 = (this->features).descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind;
          goto LAB_00192d11;
        case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
          VVar5 = (this->features).descriptor_indexing.
                  descriptorBindingUniformTexelBufferUpdateAfterBind;
LAB_00192caa:
          if ((bVar13 & VVar5 == 0) == 0) {
            pkVar12 = (key_type *)local_a8;
            break;
          }
LAB_00192d49:
          bVar23 = false;
          goto LAB_00192de6;
        case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
          VVar5 = (this->features).descriptor_indexing.
                  descriptorBindingStorageTexelBufferUpdateAfterBind;
LAB_00192d11:
          if ((bVar13 & VVar5 == 0) == 0) {
            pkVar12 = (key_type *)(local_a8 + 4);
            break;
          }
          goto LAB_00192d49;
        case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
          if ((bVar13 & (this->features).descriptor_indexing.
                        descriptorBindingUniformBufferUpdateAfterBind == 0) != 0) goto LAB_00192d49;
          pkVar12 = (key_type *)(local_a8 + 0xc);
          break;
        case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
          if ((bVar13 & (this->features).descriptor_indexing.
                        descriptorBindingStorageBufferUpdateAfterBind == 0) != 0) goto LAB_00192d49;
          pkVar12 = (key_type *)(local_a8 + 8);
          break;
        case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC:
          if (bVar13 != 0) goto LAB_00192d49;
          pkVar12 = (key_type *)(local_a8 + 0x18);
          break;
        case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC:
          if (bVar13 != 0) goto LAB_00192d49;
          pkVar12 = (key_type *)(local_a8 + 0x1c);
          break;
        case VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT:
          if (bVar13 != 0) goto LAB_00192d49;
          pkVar12 = (key_type *)(local_a8 + 0x10);
          break;
        default:
          if (VVar3 == VK_DESCRIPTOR_TYPE_INLINE_UNIFORM_BLOCK) {
            if (((this->features).inline_uniform_block.inlineUniformBlock == 0) ||
               ((this->props).inline_uniform_block.maxInlineUniformBlockSize <
                pVVar14[uVar21].descriptorCount)) goto LAB_00192d49;
            bVar23 = false;
            if ((bVar13 & (this->features).inline_uniform_block.
                          descriptorBindingInlineUniformBlockUpdateAfterBind == 0) == 0) {
LAB_00192dbf:
              pkVar12 = (key_type *)0x0;
              break;
            }
          }
          goto LAB_00192de6;
        }
LAB_00192dc1:
        if (pkVar12 != (key_type *)0x0) {
          *(uint32_t *)&(pkVar12->_M_dataplus)._M_p =
               *(int *)&(pkVar12->_M_dataplus)._M_p +
               (&info->pBindings->descriptorCount)[lVar20 * 2];
        }
        local_60 = (ulong)((int)local_60 + (&info->pBindings->descriptorCount)[lVar20 * 2]);
        bVar23 = true;
LAB_00192de6:
        if (!bVar23) break;
        uVar21 = uVar21 + 1;
        bVar22 = uVar21 < info->bindingCount;
        if (!bVar22) break;
        pVVar14 = info->pBindings;
        bVar23 = shader_stage_mask_is_supported(this,pVVar14[uVar21].stageFlags);
      } while (bVar23);
      uVar15 = (uint)local_60;
      uVar18 = local_88.field_2._12_4_;
    }
    else {
      uVar18 = 0;
    }
  }
  if (!bVar22) {
    VVar5 = (this->features).maintenance7.maintenance7;
    if ((uVar2 & 2) == 0) {
      if (VVar5 == 0) {
        if ((this->props2).properties.limits.maxDescriptorSetUniformBuffersDynamic <
            (uint)auStack_90._0_4_) {
          return false;
        }
        if ((this->props2).properties.limits.maxDescriptorSetStorageBuffersDynamic <
            (uint)auStack_90._4_4_) {
          return false;
        }
      }
      else {
        if ((this->props).maintenance7.maxDescriptorSetTotalUniformBuffersDynamic <
            (uint)auStack_90._0_4_) {
          return false;
        }
        if ((this->props).maintenance7.maxDescriptorSetTotalStorageBuffersDynamic <
            (uint)auStack_90._4_4_) {
          return false;
        }
        if ((this->props).maintenance7.maxDescriptorSetTotalBuffersDynamic <
            (uint)(auStack_90._4_4_ + auStack_90._0_4_)) {
          return false;
        }
      }
      if ((this->props2).properties.limits.maxDescriptorSetUniformBuffers < (uint)auStack_9c) {
        return false;
      }
      if ((this->props2).properties.limits.maxDescriptorSetStorageBuffers < (uint)local_a8._8_4_) {
        return false;
      }
      if ((this->props2).properties.limits.maxDescriptorSetSampledImages < (uint)local_a8._0_4_) {
        return false;
      }
      if ((this->props2).properties.limits.maxDescriptorSetStorageImages < (uint)local_a8._4_4_) {
        return false;
      }
      if ((this->props2).properties.limits.maxDescriptorSetSamplers < (uint)local_98._4_4_) {
        return false;
      }
      if ((this->props2).properties.limits.maxDescriptorSetInputAttachments < (uint)local_98._0_4_)
      {
        return false;
      }
      uVar2 = (this->props).acceleration_structure.maxDescriptorSetAccelerationStructures;
    }
    else {
      if (VVar5 == 0) {
        if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic <
            (uint)auStack_90._0_4_) {
          return false;
        }
        if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic <
            (uint)auStack_90._4_4_) {
          return false;
        }
      }
      else {
        if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic <
            (uint)auStack_90._0_4_) {
          return false;
        }
        if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic <
            (uint)auStack_90._4_4_) {
          return false;
        }
        if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic <
            (uint)(auStack_90._4_4_ + auStack_90._0_4_)) {
          return false;
        }
      }
      if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers <
          (uint)auStack_9c) {
        return false;
      }
      uVar2 = (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers;
      if (uVar2 < (uint)local_a8._8_4_) {
        return false;
      }
      if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages <
          (uint)local_a8._0_4_) {
        return false;
      }
      if (uVar2 < (uint)local_a8._4_4_) {
        return false;
      }
      if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers <
          (uint)local_98._4_4_) {
        return false;
      }
      if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments <
          (uint)local_98._0_4_) {
        return false;
      }
      uVar2 = (this->props).acceleration_structure.
              maxDescriptorSetUpdateAfterBindAccelerationStructures;
    }
    if ((((uint)local_88._M_dataplus._M_p <= uVar2) &&
        (((info->flags & 1) == 0 || (uVar15 <= (this->props).push_descriptor.maxPushDescriptors))))
       && (((uVar18 & 1) == 0 ||
           ((pDVar6 = this->query, pDVar6 == (DeviceQueryInterface *)0x0 ||
            (cVar8 = (**(code **)(*(long *)pDVar6 + 0x18))(pDVar6,info), cVar8 != '\0')))))) {
      bVar22 = pnext_chain_is_supported(this,info->pNext);
      return bVar22;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::descriptor_set_layout_is_supported(const VkDescriptorSetLayoutCreateInfo *info) const
{
	bool must_check_set_layout_before_accept = false;

	// Only allow flags we recognize and validate.
	constexpr VkDescriptorSetLayoutCreateFlags supported_flags =
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_EMBEDDED_IMMUTABLE_SAMPLERS_BIT_EXT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_INDIRECT_BINDABLE_BIT_NV |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_PER_STAGE_BIT_NV;

	if ((info->flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR) != 0)
	{
		if (enabled_extensions.count(VK_KHR_PUSH_DESCRIPTOR_EXTENSION_NAME) == 0 && features.vk14.pushDescriptor == 0)
			return false;
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT) != 0)
	{
		// There doesn't seem to be a specific feature bit for this flag, key it on extension being enabled.
		// For specific descriptor types, we check the individual features.
		if (enabled_extensions.count(VK_EXT_DESCRIPTOR_INDEXING_EXTENSION_NAME) == 0 && !features.vk12.descriptorIndexing)
			return false;
	}

	if ((info->flags & (VK_DESCRIPTOR_SET_LAYOUT_CREATE_EMBEDDED_IMMUTABLE_SAMPLERS_BIT_EXT |
	                    VK_DESCRIPTOR_SET_LAYOUT_CREATE_DESCRIPTOR_BUFFER_BIT_EXT)) != 0)
	{
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

		if (info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR)
		{
			if (!features.descriptor_buffer.descriptorBufferPushDescriptors)
				return false;
		}
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_INDIRECT_BINDABLE_BIT_NV) != 0 &&
	    features.device_generated_commands_compute_nv.deviceGeneratedCompute == VK_FALSE)
		return false;

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PER_STAGE_BIT_NV) != 0 &&
	    features.per_stage_descriptor_set_nv.perStageDescriptorSet == VK_FALSE)
		return false;

	struct DescriptorCounts
	{
		uint32_t sampled_image;
		uint32_t storage_image;
		uint32_t ssbo;
		uint32_t ubo;
		uint32_t input_attachment;
		uint32_t sampler;
		uint32_t ubo_dynamic;
		uint32_t ssbo_dynamic;
		uint32_t acceleration_structure;
	};
	DescriptorCounts counts = {};
	uint32_t total_count = 0;

	auto *flags = find_pnext<VkDescriptorSetLayoutBindingFlagsCreateInfo>(
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO,
			info->pNext);

	auto *mutable_info = find_pnext<VkMutableDescriptorTypeCreateInfoEXT>(
			VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT,
			info->pNext);

	bool pool_is_update_after_bind = (info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT) != 0;

	for (unsigned i = 0; i < info->bindingCount; i++)
	{
		if (!shader_stage_mask_is_supported(info->pBindings[i].stageFlags))
			return false;

		constexpr VkDescriptorBindingFlags supported_binding_flags =
				VK_DESCRIPTOR_BINDING_UPDATE_AFTER_BIND_BIT |
				VK_DESCRIPTOR_BINDING_UPDATE_UNUSED_WHILE_PENDING_BIT |
				VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT |
				VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT;

		if (flags && (flags->pBindingFlags[i] & ~supported_binding_flags) != 0)
			return false;

		bool binding_is_update_after_bind =
				flags && i < flags->bindingCount &&
				(flags->pBindingFlags[i] & VK_DESCRIPTOR_BINDING_UPDATE_AFTER_BIND_BIT) != 0;

		uint32_t *count = nullptr;

		switch (info->pBindings[i].descriptorType)
		{
		case VK_DESCRIPTOR_TYPE_INLINE_UNIFORM_BLOCK_EXT:
			if (features.inline_uniform_block.inlineUniformBlock == VK_FALSE)
				return false;
			// TODO: maxInlineUniformTotalSize, but this shouldn't matter when we use the EXT.
			if (info->pBindings[i].descriptorCount > props.inline_uniform_block.maxInlineUniformBlockSize)
				return false;
			if (binding_is_update_after_bind && features.inline_uniform_block.descriptorBindingInlineUniformBlockUpdateAfterBind == VK_FALSE)
				return false;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.ssbo;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.ubo;
			break;

		case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
		case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampled_image;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampled_image;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.storage_image;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.storage_image;
			break;

		case VK_DESCRIPTOR_TYPE_SAMPLER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampler;
			break;

		case VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.input_attachment;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.ubo_dynamic;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.ssbo_dynamic;
			break;

		case VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR:
			if (binding_is_update_after_bind &&
			    features.acceleration_structure.descriptorBindingAccelerationStructureUpdateAfterBind == VK_FALSE)
				return false;
			if (features.acceleration_structure.accelerationStructure == VK_FALSE)
				return false;
			count = &counts.acceleration_structure;
			break;

		case VK_DESCRIPTOR_TYPE_MUTABLE_EXT:
		{
			DescriptorCounts mutable_counts = {};
			if (features.mutable_descriptor_type.mutableDescriptorType == VK_FALSE)
				return false;
			if (!mutable_info || i >= mutable_info->mutableDescriptorTypeListCount)
				return false;

			auto &list = mutable_info->pMutableDescriptorTypeLists[i];

			for (uint32_t j = 0; j < list.descriptorTypeCount; j++)
			{
				switch (list.pDescriptorTypes[j])
				{
				case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.ssbo = 1;
					break;

				case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.ubo = 1;
					break;

				case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.sampled_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.sampled_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.storage_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.storage_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_SAMPLER:
					// Sampler is a non-standard type for mutable
					mutable_counts.sampled_image = 1;
					must_check_set_layout_before_accept = true;
					break;

				default:
					return false;
				}
			}

			counts.sampled_image += info->pBindings[i].descriptorCount * mutable_counts.sampled_image;
			counts.storage_image += info->pBindings[i].descriptorCount * mutable_counts.storage_image;
			counts.ubo += info->pBindings[i].descriptorCount * mutable_counts.ubo;
			counts.ssbo += info->pBindings[i].descriptorCount * mutable_counts.ssbo;
			break;
		}

		case VK_DESCRIPTOR_TYPE_BLOCK_MATCH_IMAGE_QCOM:
		case VK_DESCRIPTOR_TYPE_SAMPLE_WEIGHT_IMAGE_QCOM:
			if (enabled_extensions.count(VK_QCOM_IMAGE_PROCESSING_EXTENSION_NAME) == 0)
				return false;
			// *shrug*
			count = nullptr;
			break;

		default:
			return false;
		}

		if (count)
			*count += info->pBindings[i].descriptorCount;
		total_count += info->pBindings[i].descriptorCount;
	}

	if (pool_is_update_after_bind)
	{
		if (features.maintenance7.maintenance7)
		{
			if (counts.ubo_dynamic > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic)
				return false;
			if ((counts.ubo_dynamic + counts.ssbo_dynamic) > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic)
				return false;
		}
		else
		{
			if (counts.ubo_dynamic > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic)
				return false;
		}
		if (counts.ubo > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers)
			return false;
		if (counts.ssbo > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers)
			return false;
		if (counts.sampled_image > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages)
			return false;
		if (counts.storage_image > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers)
			return false;
		if (counts.sampler > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers)
			return false;
		if (counts.input_attachment > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments)
			return false;
		if (counts.acceleration_structure > props.acceleration_structure.maxDescriptorSetUpdateAfterBindAccelerationStructures)
			return false;
	}
	else
	{
		if (features.maintenance7.maintenance7)
		{
			if (counts.ubo_dynamic > props.maintenance7.maxDescriptorSetTotalUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.maintenance7.maxDescriptorSetTotalStorageBuffersDynamic)
				return false;
			if ((counts.ubo_dynamic + counts.ssbo_dynamic) > props.maintenance7.maxDescriptorSetTotalBuffersDynamic)
				return false;
		}
		else
		{
			if (counts.ubo_dynamic > props2.properties.limits.maxDescriptorSetUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props2.properties.limits.maxDescriptorSetStorageBuffersDynamic)
				return false;
		}
		if (counts.ubo > props2.properties.limits.maxDescriptorSetUniformBuffers)
			return false;
		if (counts.ssbo > props2.properties.limits.maxDescriptorSetStorageBuffers)
			return false;
		if (counts.sampled_image > props2.properties.limits.maxDescriptorSetSampledImages)
			return false;
		if (counts.storage_image > props2.properties.limits.maxDescriptorSetStorageImages)
			return false;
		if (counts.sampler > props2.properties.limits.maxDescriptorSetSamplers)
			return false;
		if (counts.input_attachment > props2.properties.limits.maxDescriptorSetInputAttachments)
			return false;
		if (counts.acceleration_structure > props.acceleration_structure.maxDescriptorSetAccelerationStructures)
			return false;
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR) != 0 &&
	    total_count > props.push_descriptor.maxPushDescriptors)
	{
		return false;
	}

	if (must_check_set_layout_before_accept)
	{
		if (query && !query->descriptor_set_layout_is_supported(info))
			return false;
	}

	return pnext_chain_is_supported(info->pNext);
}